

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall PatternBlock::PatternBlock(PatternBlock *this,PatternBlock *a,PatternBlock *b)

{
  PatternBlock *this_00;
  PatternBlock *res;
  PatternBlock *b_local;
  PatternBlock *a_local;
  PatternBlock *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->maskvec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->valvec);
  this_00 = intersect(a,b);
  this->offset = this_00->offset;
  this->nonzerosize = this_00->nonzerosize;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->maskvec,&this_00->maskvec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->valvec,&this_00->valvec);
  if (this_00 != (PatternBlock *)0x0) {
    ~PatternBlock(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

PatternBlock::PatternBlock(const PatternBlock *a,const PatternBlock *b)

{				// Construct PatternBlock by ANDing two others together
  PatternBlock *res = a->intersect(b);
  offset = res->offset;
  nonzerosize = res->nonzerosize;
  maskvec = res->maskvec;
  valvec = res->valvec;
  delete res;
}